

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

void __thiscall mognetwork::Packet::~Packet(Packet *this)

{
  void *in_RDI;
  Packet *unaff_retaddr;
  
  ~Packet(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

Packet::~Packet()
  {
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
  }